

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpdf_u3d.c
# Opt level: O3

HPDF_Dict_conflict HPDF_3DView_New(HPDF_MMgr mmgr,HPDF_Xref xref,HPDF_U3D u3d,char *name)

{
  HPDF_Dict dict;
  HPDF_STATUS HVar1;
  HPDF_String p_Var2;
  
  if ((((name != (char *)0x0) && (*name != '\0')) &&
      (dict = HPDF_Dict_New(mmgr), dict != (HPDF_Dict)0x0)) &&
     (HVar1 = HPDF_Xref_Add(xref,dict), HVar1 == 0)) {
    HVar1 = HPDF_Dict_AddName(dict,"TYPE","3DView");
    if (HVar1 == 0) {
      p_Var2 = HPDF_String_New(mmgr,name,(HPDF_Encoder_conflict)0x0);
      HVar1 = HPDF_Dict_Add(dict,"XN",p_Var2);
      if (HVar1 == 0) {
        p_Var2 = HPDF_String_New(mmgr,name,(HPDF_Encoder_conflict)0x0);
        HVar1 = HPDF_Dict_Add(dict,"IN",p_Var2);
        if ((HVar1 == 0) && (HVar1 = HPDF_U3D_Add3DView(u3d,dict), HVar1 == 0)) {
          return dict;
        }
      }
    }
    HPDF_Dict_Free(dict);
  }
  return (HPDF_Dict_conflict)0x0;
}

Assistant:

HPDF_Dict HPDF_3DView_New( HPDF_MMgr  mmgr, HPDF_Xref  xref, HPDF_U3D u3d, const char *name)
{
	HPDF_STATUS ret = HPDF_OK;
	HPDF_Dict view;

	HPDF_PTRACE ((" HPDF_3DView_New\n"));

	if (name == NULL || name[0] == '\0') {
		return NULL;
	}

	view = HPDF_Dict_New (mmgr);
	if (!view) {
		return NULL;
	}

	if (HPDF_Xref_Add (xref, view) != HPDF_OK)
        return NULL;

	ret = HPDF_Dict_AddName (view, "TYPE", "3DView");
	if (ret != HPDF_OK) {
		HPDF_Dict_Free (view);
		return NULL;
	}

	ret = HPDF_Dict_Add (view, "XN", HPDF_String_New (mmgr, name, NULL));
	if (ret != HPDF_OK) {
		HPDF_Dict_Free (view);
		return NULL;
	}

	ret = HPDF_Dict_Add (view, "IN", HPDF_String_New (mmgr, name, NULL));
	if (ret != HPDF_OK) {
		HPDF_Dict_Free (view);
		return NULL;
	}

	ret = HPDF_U3D_Add3DView( u3d, view);
	if (ret != HPDF_OK) {
		HPDF_Dict_Free (view);
		return NULL;
	}

	return view;
}